

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O1

void * absl::lts_20250127::container_internal::
       Allocate<8ul,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor_const*>>>
                 (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_google::protobuf::Descriptor_*>_>
                  *alloc,size_t n)

{
  AlignedType<8UL> *pAVar1;
  A my_mem_alloc;
  new_allocator<absl::lts_20250127::container_internal::AlignedType<8UL>_> local_1;
  
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/container_memory.h"
                  ,0x3a,
                  "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>]"
                 );
  }
  pAVar1 = __gnu_cxx::new_allocator<absl::lts_20250127::container_internal::AlignedType<8UL>_>::
           allocate(&local_1,n + 7 >> 3,(void *)0x0);
  if (((ulong)pAVar1 & 7) == 0) {
    return pAVar1;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/container/internal/container_memory.h"
                ,0x44,
                "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const std::basic_string<char>, const google::protobuf::Descriptor *>>]"
               );
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  void* p = AT::allocate(my_mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}